

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

bool ON_ReversePointGrid(int dim,bool is_rat,int point_count0,int point_count1,int point_stride0,
                        int point_stride1,double *p,int dir)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  
  if (dir == 0) {
    if (0 < point_count1) {
      uVar3 = 0;
      bVar2 = false;
      while (bVar1 = ON_ReversePointList(dim,is_rat,point_count0,point_stride0,p), bVar1) {
        bVar2 = (bool)(bVar2 | uVar3 == 0);
        uVar3 = uVar3 + 1;
        p = p + point_stride1;
        if ((uint)point_count1 == uVar3) {
          return bVar2;
        }
      }
    }
  }
  else if (0 < point_count0) {
    uVar3 = 0;
    bVar2 = false;
    while (bVar1 = ON_ReversePointList(dim,is_rat,point_count1,point_stride1,p), bVar1) {
      bVar2 = (bool)(bVar2 | uVar3 == 0);
      uVar3 = uVar3 + 1;
      p = p + point_stride0;
      if ((uint)point_count0 == uVar3) {
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool 
ON_ReversePointGrid(
        int dim,
        bool is_rat,
        int point_count0, int point_count1,
        int point_stride0, int point_stride1,
        double* p,
        int dir
        )
{
  bool rc = false;
  if ( !dir ) {
    rc = ON_ReversePointGrid( dim, is_rat, point_count1, point_count0, point_stride1, point_stride0, p, 1 );
  }
  else {
    int i;
    for ( i = 0; i < point_count0; i++ ) {
      if ( !ON_ReversePointList( dim, is_rat, point_count1, point_stride1, p + i*point_stride0 ) ) {
        rc = false;
        break;
      }
      else if (!i) {
        rc = true;
      }
    }
  }
  return rc;
}